

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O2

wchar_t * ON_wString::ToNumber(wchar_t *buffer,ON__UINT64 value_on_failure,ON__UINT64 *value)

{
  wchar_t c;
  bool bAcceptOrdinarySign;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  wchar_t *pwVar8;
  
  if (value == (ON__UINT64 *)0x0) {
    return (wchar_t *)0x0;
  }
  uVar7 = value_on_failure;
  if (buffer == (wchar_t *)0x0) {
    pwVar8 = (wchar_t *)0x0;
    goto LAB_005c802e;
  }
  c = *buffer;
  iVar3 = PlusOrMinusSignFromWideChar(c,true,true,true);
  pwVar8 = buffer + (0 < iVar3);
  bVar2 = false;
  bAcceptOrdinarySign = IsDecimalDigit(*pwVar8,true,false,false);
  bVar1 = false;
  if (bAcceptOrdinarySign) {
LAB_005c7fb8:
    iVar4 = PlusOrMinusSignFromWideChar(c,bAcceptOrdinarySign,bVar1,bVar2);
    if (iVar3 == iVar4) {
      uVar7 = 0;
      while (uVar5 = DecimalDigitFromWideChar(*pwVar8,bAcceptOrdinarySign,bVar1,bVar2,10),
            uVar5 < 10) {
        uVar6 = uVar7 * 10 + (ulong)uVar5;
        if (uVar6 < uVar7) {
          pwVar8 = (wchar_t *)0x0;
          uVar7 = value_on_failure;
          break;
        }
        pwVar8 = pwVar8 + 1;
        uVar7 = uVar6;
      }
      goto LAB_005c802e;
    }
  }
  else {
    bVar2 = false;
    bVar1 = IsDecimalDigit(*pwVar8,false,true,false);
    if (bVar1) {
      bVar1 = true;
      goto LAB_005c7fb8;
    }
    bVar1 = false;
    bVar2 = IsDecimalDigit(*pwVar8,false,false,true);
    if (bVar2) {
      bVar2 = true;
      goto LAB_005c7fb8;
    }
  }
  pwVar8 = (wchar_t *)0x0;
LAB_005c802e:
  *value = uVar7;
  return pwVar8;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  ON__UINT64 value_on_failure,
  ON__UINT64* value
  )
{
  if (nullptr == value)
    return nullptr;

  ON__UINT64 u = value_on_failure;
  const wchar_t* rc = nullptr;

  if (nullptr != buffer)
  {
    const wchar_t c0 = buffer[0];
    const int sign = ON_wString::PlusOrMinusSignFromWideChar(c0,true,true,true);
    if (sign > 0)
      ++buffer; // c0 is some type of plus sign.

    const bool b0 = ON_wString::IsDecimalDigit(buffer[0], true, false, false);
    const bool b1 = false == b0 && ON_wString::IsDecimalDigit(buffer[0], false, true, false);
    const bool b2 = false == b0 && false == b1 && ON_wString::IsDecimalDigit(buffer[0], false, false, true);

    if ((b0 || b1 || b2) && sign == ON_wString::PlusOrMinusSignFromWideChar(c0, b0, b1, b2))
    {
      ON__UINT64 r = 0;
      for (const wchar_t* s = buffer;/*empty test*/; s++)
      {
        const ON__UINT64 d = (ON__UINT64)ON_wString::DecimalDigitFromWideChar(*s, b0, b1, b2, 10);
        if (d < 10LLU)
        {
          const ON__UINT64 r1 = r * 10LLU + d;
          if (r1 < r)
          {
            // overflow
            break;
          }
          r = r1;
          continue;
        }
        u = r;
        rc = s;
        break;
      }
    }
  }

  *value = u;
  return rc;
}